

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

MIR_item_t get_string_data(c2m_ctx_t c2m_ctx,node_t_conflict n)

{
  MIR_context_t ctx_00;
  MIR_str_t str;
  DLIST_MIR_module_t *list;
  MIR_module_t module_00;
  MIR_module_t module;
  char buff [50];
  MIR_item_t local_28;
  MIR_item_t data;
  MIR_context_t ctx;
  node_t_conflict n_local;
  c2m_ctx_t c2m_ctx_local;
  
  ctx_00 = c2m_ctx->ctx;
  list = MIR_get_module_list(ctx_00);
  module_00 = DLIST_MIR_module_t_tail(list);
  _MIR_get_temp_item_name(ctx_00,module_00,(char *)&module,0x32);
  if (n->code == N_STR) {
    str.s = (n->u).s.s;
    str.len = (n->u).s.len;
    local_28 = MIR_new_string_data(ctx_00,(char *)&module,str);
  }
  else {
    if ((n->code != N_STR16) && (n->code != N_STR32)) {
      __assert_fail("n->code == N_STR16 || n->code == N_STR32",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2e2b,"MIR_item_t get_string_data(c2m_ctx_t, node_t)");
    }
    if (n->code == N_STR16) {
      local_28 = MIR_new_data(ctx_00,(char *)&module,MIR_T_U16,(n->u).s.len >> 1,(n->u).s.s);
    }
    else {
      local_28 = MIR_new_data(ctx_00,(char *)&module,MIR_T_U32,(n->u).s.len >> 2,(n->u).s.s);
    }
  }
  move_item_to_module_start(module_00,local_28);
  return local_28;
}

Assistant:

static MIR_item_t get_string_data (c2m_ctx_t c2m_ctx, node_t n) {
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_item_t data;
  char buff[50];
  MIR_module_t module = DLIST_TAIL (MIR_module_t, *MIR_get_module_list (ctx));

  _MIR_get_temp_item_name (ctx, module, buff, sizeof (buff));
  if (n->code == N_STR) {
    data = MIR_new_string_data (ctx, buff, (MIR_str_t){n->u.s.len, n->u.s.s});
  } else {
    assert (n->code == N_STR16 || n->code == N_STR32);
    if (n->code == N_STR16) {
      data = MIR_new_data (ctx, buff, MIR_T_U16, n->u.s.len / 2, n->u.s.s);
    } else {
      data = MIR_new_data (ctx, buff, MIR_T_U32, n->u.s.len / 4, n->u.s.s);
    }
  }
  move_item_to_module_start (module, data);
  return data;
}